

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garbage_collection.cpp
# Opt level: O0

void scm::markSchemeObject(Object *obj)

{
  ObjectTypeTag OVar1;
  Object *pOVar2;
  schemeException *this;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Object *local_10;
  Object *obj_local;
  
  local_10 = obj;
  OVar1 = getTag(obj);
  if (3 < OVar1 - TAG_INT) {
    if (OVar1 == TAG_CONS) {
      pOVar2 = getCar(local_10);
      markSchemeObject(pOVar2);
      pOVar2 = getCdr(local_10);
      markSchemeObject(pOVar2);
      return;
    }
    if (3 < OVar1 - TAG_NIL) {
      if (OVar1 == TAG_FUNC_USER) {
        pOVar2 = getUserFunctionArgList(local_10);
        markSchemeObject(pOVar2);
        pOVar2 = getUserFunctionBodyList(local_10);
        markSchemeObject(pOVar2);
        return;
      }
      if (2 < OVar1 - TAG_SYNTAX) {
        this = (schemeException *)__cxa_allocate_exception(0x30);
        std::__cxx11::to_string(&local_70,*(int *)&(local_10->super_Collectable).field_0x14);
        std::operator+(&local_50,"tag ",&local_70);
        std::operator+(&local_30,&local_50," isn\'t handled yet");
        schemeException::schemeException
                  (this,&local_30,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/src/garbage_collection.cpp"
                   ,0x41);
        __cxa_throw(this,&schemeException::typeinfo,schemeException::~schemeException);
      }
    }
  }
  (local_10->super_Collectable).marked = true;
  return;
}

Assistant:

void markSchemeObject(Object* obj)
{
  switch (getTag(obj)) {
    // in most cases, simply mark the object
    case TAG_INT:
    case TAG_FLOAT:
    case TAG_STRING:
    case TAG_SYMBOL:
    case TAG_NIL:
    case TAG_TRUE:
    case TAG_FALSE:
    case TAG_VOID:
    case TAG_EOF:
    case TAG_FUNC_BUILTIN:
    case TAG_SYNTAX:
      obj->marked = true;
      break;
    // user functions consist of two cons objects, the argument and bodylist
    case TAG_FUNC_USER:
      markSchemeObject(getUserFunctionArgList(obj));
      markSchemeObject(getUserFunctionBodyList(obj));
      break;
    // recur until we've reached the end of the list
    case TAG_CONS:
      markSchemeObject(getCar(obj));
      markSchemeObject(getCdr(obj));
      break;

    default:
      schemeThrow("tag " + std::to_string(obj->tag) + " isn't handled yet");
      break;
  }
}